

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O0

void * NewtObjData(newtObjRef obj)

{
  _Bool _Var1;
  void *data;
  newtObjRef obj_local;
  
  obj_local = obj + 1;
  _Var1 = NewtObjIsLiteral(obj);
  if (!_Var1) {
    obj_local = *(newtObjRef *)&obj_local->header;
  }
  return obj_local;
}

Assistant:

void * NewtObjData(newtObjRef obj)
{
    void *	data;
    
    data = (void *)(obj + 1);
    
    if (NewtObjIsLiteral(obj))
        return data;
    else
        return *((void **)data);
}